

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaVirtualBlock_T::Allocate
          (VmaVirtualBlock_T *this,VmaVirtualAllocationCreateInfo *createInfo,
          VmaVirtualAllocation *outAllocation,VkDeviceSize *outOffset)

{
  long *plVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  VmaAllocationRequest request;
  unsigned_long local_68;
  undefined8 local_60;
  undefined8 local_58;
  iterator iStack_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  VkResult local_4;
  
  local_60 = 0;
  local_58 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  VmaList<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::iterator::iterator(&iStack_50);
  local_40 = 0;
  local_38 = 0;
  local_30 = 0;
  plVar1 = *(long **)(in_RDI + 0x38);
  uVar4 = *local_18;
  local_68 = 1;
  puVar2 = std::max<unsigned_long>(local_18 + 1,&local_68);
  uVar3 = (**(code **)(*plVar1 + 0x88))
                    (plVar1,uVar4,*puVar2,(*(uint *)(local_18 + 2) & 0x40) != 0,1,
                     *(uint *)(local_18 + 2) & 0x70000,&local_60);
  if ((uVar3 & 1) == 0) {
    *local_20 = 0;
    if (local_28 != (undefined8 *)0x0) {
      *local_28 = 0xffffffffffffffff;
    }
    local_4 = VK_ERROR_OUT_OF_DEVICE_MEMORY;
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x98))
              (*(long **)(in_RDI + 0x38),&local_60,1,local_18[3]);
    *local_20 = local_60;
    if (local_28 != (undefined8 *)0x0) {
      uVar4 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x48))(*(long **)(in_RDI + 0x38),local_60);
      *local_28 = uVar4;
    }
    local_4 = VK_SUCCESS;
  }
  return local_4;
}

Assistant:

VkResult VmaVirtualBlock_T::Allocate(const VmaVirtualAllocationCreateInfo& createInfo, VmaVirtualAllocation& outAllocation,
    VkDeviceSize* outOffset)
{
    VmaAllocationRequest request = {};
    if (m_Metadata->CreateAllocationRequest(
        createInfo.size, // allocSize
        VMA_MAX(createInfo.alignment, (VkDeviceSize)1), // allocAlignment
        (createInfo.flags & VMA_VIRTUAL_ALLOCATION_CREATE_UPPER_ADDRESS_BIT) != 0, // upperAddress
        VMA_SUBALLOCATION_TYPE_UNKNOWN, // allocType - unimportant
        createInfo.flags & VMA_VIRTUAL_ALLOCATION_CREATE_STRATEGY_MASK, // strategy
        &request))
    {
        m_Metadata->Alloc(request,
            VMA_SUBALLOCATION_TYPE_UNKNOWN, // type - unimportant
            createInfo.pUserData);
        outAllocation = (VmaVirtualAllocation)request.allocHandle;
        if(outOffset)
            *outOffset = m_Metadata->GetAllocationOffset(request.allocHandle);
        return VK_SUCCESS;
    }
    outAllocation = (VmaVirtualAllocation)VK_NULL_HANDLE;
    if (outOffset)
        *outOffset = UINT64_MAX;
    return VK_ERROR_OUT_OF_DEVICE_MEMORY;
}